

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O0

ASYNC_JOB * async_get_pool_job(void)

{
  int iVar1;
  async_fibre *fibre;
  async_pool *pool;
  ASYNC_JOB *job;
  ASYNC_JOB *local_10;
  
  fibre = (async_fibre *)CRYPTO_THREAD_get_local((CRYPTO_THREAD_LOCAL *)0x386da0);
  if (fibre == (async_fibre *)0x0) {
    iVar1 = ASYNC_init_thread((size_t)job,(size_t)pool);
    if (iVar1 == 0) {
      return (ASYNC_JOB *)0x0;
    }
    fibre = (async_fibre *)CRYPTO_THREAD_get_local((CRYPTO_THREAD_LOCAL *)0x386dd6);
  }
  local_10 = sk_ASYNC_JOB_pop((stack_st_ASYNC_JOB *)0x386de6);
  if (local_10 == (ASYNC_JOB *)0x0) {
    if (((fibre->fibre).uc_stack.ss_sp != (void *)0x0) &&
       ((ucontext_t *)(fibre->fibre).uc_stack.ss_sp <= (fibre->fibre).uc_link)) {
      return (ASYNC_JOB *)0x0;
    }
    local_10 = async_job_new();
    if (local_10 != (ASYNC_JOB *)0x0) {
      iVar1 = async_fibre_makecontext(fibre);
      if (iVar1 == 0) {
        async_job_free((ASYNC_JOB *)0x386e46);
        return (ASYNC_JOB *)0x0;
      }
      (fibre->fibre).uc_link = (ucontext_t *)((long)&((fibre->fibre).uc_link)->uc_flags + 1);
    }
  }
  return local_10;
}

Assistant:

static ASYNC_JOB *async_get_pool_job(void) {
    ASYNC_JOB *job;
    async_pool *pool;

    pool = (async_pool *)CRYPTO_THREAD_get_local(&poolkey);
    if (pool == NULL) {
        /*
         * Pool has not been initialised, so init with the defaults, i.e.
         * no max size and no pre-created jobs
         */
        if (ASYNC_init_thread(0, 0) == 0)
            return NULL;
        pool = (async_pool *)CRYPTO_THREAD_get_local(&poolkey);
    }

    job = sk_ASYNC_JOB_pop(pool->jobs);
    if (job == NULL) {
        /* Pool is empty */
        if ((pool->max_size != 0) && (pool->curr_size >= pool->max_size))
            return NULL;

        job = async_job_new();
        if (job != NULL) {
            if (! async_fibre_makecontext(&job->fibrectx)) {
                async_job_free(job);
                return NULL;
            }
            pool->curr_size++;
        }
    }
    return job;
}